

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

uint32 re2::hashword(uint32 *k,size_t length,uint32 initval)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint32 *puVar5;
  int iVar6;
  uint uVar7;
  
  uVar3 = initval + (int)length * 4 + 0xdeadbeef;
  puVar5 = k + 2;
  uVar7 = uVar3;
  uVar1 = uVar3;
  do {
    switch(length) {
    case 0:
      return uVar1;
    case 3:
      uVar1 = uVar1 + *puVar5;
    case 2:
      uVar7 = uVar7 + puVar5[-1];
    case 1:
      uVar1 = (uVar1 ^ uVar7) - (uVar7 << 0xe | uVar7 >> 0x12);
      uVar3 = (uVar3 + puVar5[-2] ^ uVar1) - (uVar1 * 0x800 | uVar1 >> 0x15);
      uVar4 = (uVar7 ^ uVar3) - (uVar3 * 0x2000000 | uVar3 >> 7);
      uVar7 = (uVar1 ^ uVar4) - (uVar4 * 0x10000 | uVar4 >> 0x10);
      uVar1 = (uVar3 ^ uVar7) - (uVar7 * 0x10 | uVar7 >> 0x1c);
      uVar1 = (uVar4 ^ uVar1) - (uVar1 * 0x4000 | uVar1 >> 0x12);
      return (uVar7 ^ uVar1) - (uVar1 * 0x1000000 | uVar1 >> 8);
    default:
      uVar1 = uVar1 + *puVar5;
      uVar3 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ (uVar3 + puVar5[-2]) - uVar1;
      iVar2 = uVar1 + uVar7 + puVar5[-1];
      uVar7 = (uVar3 << 6 | uVar3 >> 0x1a) ^ (uVar7 + puVar5[-1]) - uVar3;
      iVar6 = uVar3 + iVar2;
      uVar1 = (uVar7 << 8 | uVar7 >> 0x18) ^ iVar2 - uVar7;
      iVar2 = uVar7 + iVar6;
      uVar3 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar6 - uVar1;
      iVar6 = uVar1 + iVar2;
      uVar7 = (uVar3 << 0x13 | uVar3 >> 0xd) ^ iVar2 - uVar3;
      uVar3 = uVar3 + iVar6;
      uVar1 = (uVar7 << 4 | uVar7 >> 0x1c) ^ iVar6 - uVar7;
      uVar7 = uVar7 + uVar3;
      length = length - 3;
      puVar5 = puVar5 + 3;
    }
  } while( true );
}

Assistant:

uint32 hashword(
const uint32 *k,                   /* the key, an array of uint32_t values */
size_t          length,               /* the length of the key, in uint32_ts */
uint32        initval)         /* the previous hash, or an arbitrary value */
{
  uint32_t a,b,c;

  /* Set up the internal state */
  a = b = c = 0xdeadbeef + (((uint32_t)length)<<2) + initval;

  /*------------------------------------------------- handle most of the key */
  while (length > 3)
  {
    a += k[0];
    b += k[1];
    c += k[2];
    mix(a,b,c);
    length -= 3;
    k += 3;
  }

  /*------------------------------------------- handle the last 3 uint32_t's */
  switch(length)                     /* all the case statements fall through */
  { 
  case 3 : c+=k[2];
  case 2 : b+=k[1];
  case 1 : a+=k[0];
    final(a,b,c);
  case 0:     /* case 0: nothing left to add */
    break;
  }
  /*------------------------------------------------------ report the result */
  return c;
}